

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O2

void blend_a64_d16_mask_w16_avx2
               (uint8_t *dst,CONV_BUF_TYPE *src0,CONV_BUF_TYPE *src1,__m256i *m0,
               __m256i *v_round_offset,__m256i *v_maxval,int shift)

{
  __m256i alVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  
  alVar1 = *m0;
  auVar3 = vpsubw_avx2((undefined1  [32])*v_maxval,(undefined1  [32])alVar1);
  auVar5 = vpunpcklwd_avx2(*(undefined1 (*) [32])src0,*(undefined1 (*) [32])src1);
  auVar6 = vpunpcklwd_avx2((undefined1  [32])alVar1,auVar3);
  auVar5 = vpmaddwd_avx2(auVar5,auVar6);
  auVar6 = vpunpckhwd_avx2(*(undefined1 (*) [32])src0,*(undefined1 (*) [32])src1);
  auVar4 = vpunpckhwd_avx2((undefined1  [32])alVar1,auVar3);
  auVar5 = vpsubd_avx2(auVar5,(undefined1  [32])*v_round_offset);
  auVar3 = vpsrad_avx2(auVar5,ZEXT416((uint)shift));
  auVar5 = vpmaddwd_avx2(auVar6,auVar4);
  auVar5 = vpsubd_avx2(auVar5,(undefined1  [32])*v_round_offset);
  auVar5 = vpsrad_avx2(auVar5,ZEXT416((uint)shift));
  auVar5 = vpackssdw_avx2(auVar3,auVar5);
  auVar2 = vpackuswb_avx(auVar5._0_16_,auVar5._16_16_);
  *(undefined1 (*) [16])dst = auVar2;
  return;
}

Assistant:

static inline void blend_a64_d16_mask_w16_avx2(
    uint8_t *dst, const CONV_BUF_TYPE *src0, const CONV_BUF_TYPE *src1,
    const __m256i *m0, const __m256i *v_round_offset, const __m256i *v_maxval,
    int shift) {
  const __m256i max_minus_m0 = _mm256_sub_epi16(*v_maxval, *m0);
  const __m256i s0_0 = yy_loadu_256(src0);
  const __m256i s1_0 = yy_loadu_256(src1);
  __m256i res0_lo = _mm256_madd_epi16(_mm256_unpacklo_epi16(s0_0, s1_0),
                                      _mm256_unpacklo_epi16(*m0, max_minus_m0));
  __m256i res0_hi = _mm256_madd_epi16(_mm256_unpackhi_epi16(s0_0, s1_0),
                                      _mm256_unpackhi_epi16(*m0, max_minus_m0));
  res0_lo =
      _mm256_srai_epi32(_mm256_sub_epi32(res0_lo, *v_round_offset), shift);
  res0_hi =
      _mm256_srai_epi32(_mm256_sub_epi32(res0_hi, *v_round_offset), shift);
  const __m256i res0 = _mm256_packs_epi32(res0_lo, res0_hi);
  __m256i res = _mm256_packus_epi16(res0, res0);
  res = _mm256_permute4x64_epi64(res, 0xd8);
  _mm_storeu_si128((__m128i *)(dst), _mm256_castsi256_si128(res));
}